

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O0

bool GlobOpt::IsTypeCheckProtected(Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  Opnd *pOVar3;
  Opnd *this;
  Opnd *this_00;
  undefined4 *puVar4;
  SymOpnd *pSVar5;
  PropertySymOpnd *pPVar6;
  Opnd *opnd;
  Opnd *src2;
  Opnd *src1;
  Opnd *dst;
  Instr *instr_local;
  
  pOVar3 = IR::Instr::GetDst(instr);
  this = IR::Instr::GetSrc1(instr);
  this_00 = IR::Instr::GetSrc2(instr);
  if ((pOVar3 != (Opnd *)0x0) && (bVar2 = IR::Opnd::IsSymOpnd(pOVar3), bVar2)) {
    pSVar5 = IR::Opnd::AsSymOpnd(pOVar3);
    bVar2 = IR::SymOpnd::IsPropertySymOpnd(pSVar5);
    if ((bVar2) && ((this != (Opnd *)0x0 && (bVar2 = IR::Opnd::IsSymOpnd(this), bVar2)))) {
      pSVar5 = IR::Opnd::AsSymOpnd(this);
      bVar2 = IR::SymOpnd::IsPropertySymOpnd(pSVar5);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x58b,
                           "(!dst || !dst->IsSymOpnd() || !dst->AsSymOpnd()->IsPropertySymOpnd() || !src1 || !src1->IsSymOpnd() || !src1->AsSymOpnd()->IsPropertySymOpnd())"
                           ,"No instruction should have a src1 and dst be a PropertySymOpnd.");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
    }
  }
  if ((this_00 != (Opnd *)0x0) && (bVar2 = IR::Opnd::IsSymOpnd(this_00), bVar2)) {
    pSVar5 = IR::Opnd::AsSymOpnd(this_00);
    bVar2 = IR::SymOpnd::IsPropertySymOpnd(pSVar5);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,0x58c,
                         "(!src2 || !src2->IsSymOpnd() || !src2->AsSymOpnd()->IsPropertySymOpnd())",
                         "No instruction should have a src2 be a PropertySymOpnd.");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  pOVar3 = IR::Instr::GetDst(instr);
  if ((pOVar3 != (Opnd *)0x0) && (bVar2 = IR::Opnd::IsSymOpnd(pOVar3), bVar2)) {
    pSVar5 = IR::Opnd::AsSymOpnd(pOVar3);
    bVar2 = IR::SymOpnd::IsPropertySymOpnd(pSVar5);
    if (bVar2) {
      pPVar6 = IR::Opnd::AsPropertySymOpnd(pOVar3);
      bVar2 = IR::PropertySymOpnd::IsTypeCheckProtected(pPVar6);
      return bVar2;
    }
  }
  pOVar3 = IR::Instr::GetSrc1(instr);
  if ((pOVar3 != (Opnd *)0x0) && (bVar2 = IR::Opnd::IsSymOpnd(pOVar3), bVar2)) {
    pSVar5 = IR::Opnd::AsSymOpnd(pOVar3);
    bVar2 = IR::SymOpnd::IsPropertySymOpnd(pSVar5);
    if (bVar2) {
      pPVar6 = IR::Opnd::AsPropertySymOpnd(pOVar3);
      bVar2 = IR::PropertySymOpnd::IsTypeCheckProtected(pPVar6);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool
GlobOpt::IsTypeCheckProtected(const IR::Instr * instr)
{
#if DBG
    IR::Opnd* dst = instr->GetDst();
    IR::Opnd* src1 = instr->GetSrc1();
    IR::Opnd* src2 = instr->GetSrc2();
    AssertMsg(!dst || !dst->IsSymOpnd() || !dst->AsSymOpnd()->IsPropertySymOpnd() ||
        !src1 || !src1->IsSymOpnd() || !src1->AsSymOpnd()->IsPropertySymOpnd(), "No instruction should have a src1 and dst be a PropertySymOpnd.");
    AssertMsg(!src2 || !src2->IsSymOpnd() || !src2->AsSymOpnd()->IsPropertySymOpnd(), "No instruction should have a src2 be a PropertySymOpnd.");
#endif

    IR::Opnd * opnd = instr->GetDst();
    if (opnd && opnd->IsSymOpnd() && opnd->AsSymOpnd()->IsPropertySymOpnd())
    {
        return opnd->AsPropertySymOpnd()->IsTypeCheckProtected();
    }
    opnd = instr->GetSrc1();
    if (opnd && opnd->IsSymOpnd() && opnd->AsSymOpnd()->IsPropertySymOpnd())
    {
        return opnd->AsPropertySymOpnd()->IsTypeCheckProtected();
    }
    return false;
}